

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O2

bool __thiscall CConnman::DisconnectNode(CConnman *this,CSubNet *subnet)

{
  pointer ppCVar1;
  CNode *pCVar2;
  bool bVar3;
  char *args;
  pointer ppCVar4;
  bool bVar5;
  long in_FS_OFFSET;
  string_view source_file;
  string_view logging_function;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff58;
  undefined1 local_98 [16];
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock93;
  string local_78;
  string local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  args = "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
  bVar5 = false;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_>::UniqueLock
            (&criticalblock93,&this->m_nodes_mutex,"m_nodes_mutex",
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp",
             0xe1d,false);
  ppCVar1 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  for (ppCVar4 = (this->m_nodes).super__Vector_base<CNode_*,_std::allocator<CNode_*>_>._M_impl.
                 super__Vector_impl_data._M_start; ppCVar4 != ppCVar1; ppCVar4 = ppCVar4 + 1) {
    pCVar2 = *ppCVar4;
    bVar3 = CSubNet::Match(subnet,(CNetAddr *)&pCVar2->addr);
    if (bVar3) {
      bVar3 = ::LogAcceptCategory(NET,Debug);
      bVar5 = fLogIPs;
      if (bVar3) {
        if (fLogIPs == true) {
          CSubNet::ToString_abi_cxx11_(&local_78,subnet);
          tinyformat::format<std::__cxx11::string>
                    (&local_58,(tinyformat *)0xca42ef,(char *)&local_78,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_58,"",(allocator<char> *)(local_98 + 0xf));
        }
        local_98._0_8_ = pCVar2->id;
        args = local_98;
        source_file._M_str =
             "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/net.cpp";
        source_file._M_len = 0x50;
        logging_function._M_str = "DisconnectNode";
        logging_function._M_len = 0xe;
        LogPrintf_<std::__cxx11::string,long>
                  (logging_function,source_file,0xe20,
                   IPC|I2P|QT|LIBEVENT|PROXY|PRUNE|RAND|REINDEX|SELECTCOINS|ESTIMATEFEE|RPC|BENCH|
                   MEMPOOL,(Level)&local_58,args,in_stack_ffffffffffffff58,(long *)subnet);
        std::__cxx11::string::~string((string *)&local_58);
        if (bVar5 != false) {
          std::__cxx11::string::~string((string *)&local_78);
        }
      }
      bVar5 = true;
      LOCK();
      (pCVar2->fDisconnect)._M_base._M_i = true;
      UNLOCK();
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&criticalblock93.super_unique_lock);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool CConnman::DisconnectNode(const CSubNet& subnet)
{
    bool disconnected = false;
    LOCK(m_nodes_mutex);
    for (CNode* pnode : m_nodes) {
        if (subnet.Match(pnode->addr)) {
            LogDebug(BCLog::NET, "disconnect by subnet%s matched peer=%d; disconnecting\n", (fLogIPs ? strprintf("=%s", subnet.ToString()) : ""), pnode->GetId());
            pnode->fDisconnect = true;
            disconnected = true;
        }
    }
    return disconnected;
}